

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_decode_blocks(lzh_stream *strm,wchar_t last)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  int iVar8;
  wchar_t wVar9;
  huffman_conflict *hf;
  huffman_conflict *hf_00;
  wchar_t local_a4;
  wchar_t li;
  uchar *d;
  uchar *s;
  wchar_t l;
  wchar_t p;
  wchar_t state;
  wchar_t pt_max_bits;
  wchar_t lt_max_bits;
  wchar_t w_size;
  wchar_t w_mask;
  wchar_t w_pos;
  wchar_t copy_pos;
  wchar_t copy_len;
  wchar_t c;
  wchar_t blocks_avail;
  uchar *pt_bitlen;
  uchar *lt_bitlen;
  uchar *w_buff;
  huffman_conflict *pt;
  huffman_conflict *lt;
  lzh_br bre;
  lzh_dec *ds;
  wchar_t last_local;
  lzh_stream *strm_local;
  
  bre._8_8_ = strm->ds;
  lt = (huffman_conflict *)(((lzh_dec *)bre._8_8_)->br).cache_buffer;
  bre.cache_buffer = *(uint64_t *)&(((lzh_dec *)bre._8_8_)->br).cache_avail;
  hf = &((lzh_dec *)bre._8_8_)->lt;
  hf_00 = &((lzh_dec *)bre._8_8_)->pt;
  puVar5 = ((lzh_dec *)bre._8_8_)->w_buff;
  puVar6 = (((lzh_dec *)bre._8_8_)->lt).bitlen;
  puVar7 = (((lzh_dec *)bre._8_8_)->pt).bitlen;
  copy_len = ((lzh_dec *)bre._8_8_)->blocks_avail;
  w_pos = ((lzh_dec *)bre._8_8_)->copy_len;
  w_mask = ((lzh_dec *)bre._8_8_)->copy_pos;
  w_size = ((lzh_dec *)bre._8_8_)->w_pos;
  wVar1 = ((lzh_dec *)bre._8_8_)->w_mask;
  wVar2 = ((lzh_dec *)bre._8_8_)->w_size;
  wVar3 = (((lzh_dec *)bre._8_8_)->lt).max_bits;
  wVar4 = (((lzh_dec *)bre._8_8_)->pt).max_bits;
  l = ((lzh_dec *)bre._8_8_)->state;
switchD_002a04e0_default:
  switch(l) {
  case L'\t':
    while( true ) {
      if (copy_len == L'\0') {
        *(undefined4 *)bre._8_8_ = 0;
        *(huffman_conflict **)(bre._8_8_ + 0x28) = lt;
        *(uint64_t *)(bre._8_8_ + 0x30) = bre.cache_buffer;
        *(undefined4 *)(bre._8_8_ + 0x138) = 0;
        *(wchar_t *)(bre._8_8_ + 0x18) = w_size;
        *(undefined4 *)(bre._8_8_ + 0x1c) = 0;
        return L'd';
      }
      if ((((wchar_t)bre.cache_buffer < wVar3) &&
          (wVar9 = lzh_br_fillup(strm,(lzh_br *)&lt), wVar9 == L'\0')) &&
         ((wchar_t)bre.cache_buffer < wVar3)) {
        if (last == L'\0') goto LAB_002a0a13;
        copy_pos = lzh_decode_huffman(hf,(uint)((long)lt <<
                                               ((char)wVar3 - (char)bre.cache_buffer & 0x3fU)) &
                                         0xffff & (uint)cache_masks[wVar3]);
        iVar8 = (wchar_t)bre.cache_buffer - (uint)puVar6[copy_pos];
        bre.cache_buffer = CONCAT44(bre.cache_buffer._4_4_,iVar8);
        if (iVar8 < 0) goto LAB_002a09fc;
      }
      else {
        copy_pos = lzh_decode_huffman(hf,(uint)((ulong)lt >>
                                               ((char)bre.cache_buffer - (char)wVar3 & 0x3fU)) &
                                         0xffff & (uint)cache_masks[wVar3]);
        bre.cache_buffer =
             CONCAT44(bre.cache_buffer._4_4_,(wchar_t)bre.cache_buffer - (uint)puVar6[copy_pos]);
      }
      copy_len = copy_len + L'\xffffffff';
      if (L'ÿ' < copy_pos) break;
      puVar5[w_size] = (uchar)copy_pos;
      w_size = w_size + L'\x01';
      if (wVar2 <= w_size) {
        w_size = L'\0';
        lzh_emit_window(strm,(long)wVar2);
        goto LAB_002a0a13;
      }
    }
    w_pos = copy_pos + L'\xffffff03';
    break;
  case L'\v':
    goto switchD_002a04e0_caseD_b;
  case L'\f':
    goto switchD_002a04e0_caseD_c;
  default:
    goto switchD_002a04e0_default;
  }
  if ((((wchar_t)bre.cache_buffer < wVar4) &&
      (wVar9 = lzh_br_fillup(strm,(lzh_br *)&lt), wVar9 == L'\0')) &&
     ((wchar_t)bre.cache_buffer < wVar4)) {
    if (last == L'\0') {
      l = L'\n';
      *(wchar_t *)(bre._8_8_ + 0x20) = w_pos;
      goto LAB_002a0a13;
    }
    w_mask = lzh_decode_huffman(hf_00,(uint)((long)lt <<
                                            ((char)wVar4 - (char)bre.cache_buffer & 0x3fU)) & 0xffff
                                      & (uint)cache_masks[wVar4]);
    iVar8 = (wchar_t)bre.cache_buffer - (uint)puVar7[w_mask];
    bre.cache_buffer = CONCAT44(bre.cache_buffer._4_4_,iVar8);
    if (iVar8 < 0) goto LAB_002a09fc;
  }
  else {
    w_mask = lzh_decode_huffman(hf_00,(uint)((ulong)lt >>
                                            ((char)bre.cache_buffer - (char)wVar4 & 0x3fU)) & 0xffff
                                      & (uint)cache_masks[wVar4]);
    bre.cache_buffer =
         CONCAT44(bre.cache_buffer._4_4_,(wchar_t)bre.cache_buffer - (uint)puVar7[w_mask]);
  }
switchD_002a04e0_caseD_b:
  if (L'\x01' < w_mask) {
    iVar8 = w_mask + L'\xffffffff';
    if ((((wchar_t)bre.cache_buffer < iVar8) &&
        (wVar9 = lzh_br_fillup(strm,(lzh_br *)&lt), wVar9 == L'\0')) &&
       ((wchar_t)bre.cache_buffer < iVar8)) {
      if (last != L'\0') {
LAB_002a09fc:
        *(undefined4 *)(bre._8_8_ + 0x154) = 0xffffffe7;
        return L'\xffffffe7';
      }
      l = L'\v';
      *(wchar_t *)(bre._8_8_ + 0x20) = w_pos;
      *(wchar_t *)(bre._8_8_ + 0x1c) = w_mask;
LAB_002a0a13:
      *(huffman_conflict **)(bre._8_8_ + 0x28) = lt;
      *(uint64_t *)(bre._8_8_ + 0x30) = bre.cache_buffer;
      *(wchar_t *)(bre._8_8_ + 0x138) = copy_len;
      *(wchar_t *)bre._8_8_ = l;
      *(wchar_t *)(bre._8_8_ + 0x18) = w_size;
      return L'\0';
    }
    w_mask = (1 << ((byte)iVar8 & 0x1f)) +
             ((uint)((ulong)lt >> ((char)bre.cache_buffer - (byte)iVar8 & 0x3f)) & 0xffff &
             (uint)cache_masks[iVar8]);
    bre.cache_buffer = CONCAT44(bre.cache_buffer._4_4_,(wchar_t)bre.cache_buffer - iVar8);
  }
  w_mask = (w_size - w_mask) - 1U & wVar1;
switchD_002a04e0_caseD_c:
  while( true ) {
    s._0_4_ = w_pos;
    if (w_size < w_mask) {
      if (wVar2 - w_mask < w_pos) {
        s._0_4_ = wVar2 - w_mask;
      }
    }
    else if (wVar2 - w_size < w_pos) {
      s._0_4_ = wVar2 - w_size;
    }
    if ((w_mask + (wchar_t)s < w_size) || (w_size + (wchar_t)s < w_mask)) {
      memcpy(puVar5 + w_size,puVar5 + w_mask,(long)(wchar_t)s);
    }
    else {
      for (local_a4 = L'\0'; local_a4 < (wchar_t)s + L'\xffffffff'; local_a4 = local_a4 + L'\x02') {
        puVar5[(long)local_a4 + (long)w_size] = puVar5[(long)local_a4 + (long)w_mask];
        puVar5[(long)(local_a4 + L'\x01') + (long)w_size] =
             puVar5[(long)(local_a4 + L'\x01') + (long)w_mask];
      }
      if (local_a4 < (wchar_t)s) {
        puVar5[(long)local_a4 + (long)w_size] = puVar5[(long)local_a4 + (long)w_mask];
      }
    }
    w_size = (wchar_t)s + w_size;
    if (w_size == wVar2) {
      w_size = L'\0';
      lzh_emit_window(strm,(long)wVar2);
      if ((wchar_t)s < w_pos) {
        l = L'\f';
        *(wchar_t *)(bre._8_8_ + 0x20) = w_pos - (wchar_t)s;
        *(wchar_t *)(bre._8_8_ + 0x1c) = w_mask + (wchar_t)s & wVar1;
      }
      else {
        l = L'\t';
      }
      goto LAB_002a0a13;
    }
    if (w_pos <= (wchar_t)s) break;
    w_pos = w_pos - (wchar_t)s;
    w_mask = w_mask + (wchar_t)s & wVar1;
  }
  l = L'\t';
  goto switchD_002a04e0_default;
}

Assistant:

static int
lzh_decode_blocks(struct lzh_stream *strm, int last)
{
	struct lzh_dec *ds = strm->ds;
	struct lzh_br bre = ds->br;
	struct huffman *lt = &(ds->lt);
	struct huffman *pt = &(ds->pt);
	unsigned char *w_buff = ds->w_buff;
	unsigned char *lt_bitlen = lt->bitlen;
	unsigned char *pt_bitlen = pt->bitlen;
	int blocks_avail = ds->blocks_avail, c = 0;
	int copy_len = ds->copy_len, copy_pos = ds->copy_pos;
	int w_pos = ds->w_pos, w_mask = ds->w_mask, w_size = ds->w_size;
	int lt_max_bits = lt->max_bits, pt_max_bits = pt->max_bits;
	int state = ds->state;

	for (;;) {
		switch (state) {
		case ST_GET_LITERAL:
			for (;;) {
				if (blocks_avail == 0) {
					/* We have decoded all blocks.
					 * Let's handle next blocks. */
					ds->state = ST_RD_BLOCK;
					ds->br = bre;
					ds->blocks_avail = 0;
					ds->w_pos = w_pos;
					ds->copy_pos = 0;
					return (100);
				}

				/* lzh_br_read_ahead() always tries to fill the
				 * cache buffer up. In specific situation we
				 * are close to the end of the data, the cache
				 * buffer will not be full and thus we have to
				 * determine if the cache buffer has some bits
				 * as much as we need after lzh_br_read_ahead()
				 * failed. */
				if (!lzh_br_read_ahead(strm, &bre,
				    lt_max_bits)) {
					if (!last)
						goto next_data;
					/* Remaining bits are less than
					 * maximum bits(lt.max_bits) but maybe
					 * it still remains as much as we need,
					 * so we should try to use it with
					 * dummy bits. */
					c = lzh_decode_huffman(lt,
					      lzh_br_bits_forced(&bre,
					        lt_max_bits));
					lzh_br_consume(&bre, lt_bitlen[c]);
					if (!lzh_br_has(&bre, 0))
						goto failed;/* Over read. */
				} else {
					c = lzh_decode_huffman(lt,
					      lzh_br_bits(&bre, lt_max_bits));
					lzh_br_consume(&bre, lt_bitlen[c]);
				}
				blocks_avail--;
				if (c > UCHAR_MAX)
					/* Current block is a match data. */
					break;
				/*
				 * 'c' is exactly a literal code.
				 */
				/* Save a decoded code to reference it
				 * afterward. */
				w_buff[w_pos] = c;
				if (++w_pos >= w_size) {
					w_pos = 0;
					lzh_emit_window(strm, w_size);
					goto next_data;
				}
			}
			/* 'c' is the length of a match pattern we have
			 * already extracted, which has be stored in
			 * window(ds->w_buff). */
			copy_len = c - (UCHAR_MAX + 1) + MINMATCH;
			/* FALL THROUGH */
		case ST_GET_POS_1:
			/*
			 * Get a reference position. 
			 */
			if (!lzh_br_read_ahead(strm, &bre, pt_max_bits)) {
				if (!last) {
					state = ST_GET_POS_1;
					ds->copy_len = copy_len;
					goto next_data;
				}
				copy_pos = lzh_decode_huffman(pt,
				    lzh_br_bits_forced(&bre, pt_max_bits));
				lzh_br_consume(&bre, pt_bitlen[copy_pos]);
				if (!lzh_br_has(&bre, 0))
					goto failed;/* Over read. */
			} else {
				copy_pos = lzh_decode_huffman(pt,
				    lzh_br_bits(&bre, pt_max_bits));
				lzh_br_consume(&bre, pt_bitlen[copy_pos]);
			}
			/* FALL THROUGH */
		case ST_GET_POS_2:
			if (copy_pos > 1) {
				/* We need an additional adjustment number to
				 * the position. */
				int p = copy_pos - 1;
				if (!lzh_br_read_ahead(strm, &bre, p)) {
					if (last)
						goto failed;/* Truncated data.*/
					state = ST_GET_POS_2;
					ds->copy_len = copy_len;
					ds->copy_pos = copy_pos;
					goto next_data;
				}
				copy_pos = (1 << p) + lzh_br_bits(&bre, p);
				lzh_br_consume(&bre, p);
			}
			/* The position is actually a distance from the last
			 * code we had extracted and thus we have to convert
			 * it to a position of the window. */
			copy_pos = (w_pos - copy_pos - 1) & w_mask;
			/* FALL THROUGH */
		case ST_COPY_DATA:
			/*
			 * Copy `copy_len' bytes as extracted data from
			 * the window into the output buffer.
			 */
			for (;;) {
				int l;

				l = copy_len;
				if (copy_pos > w_pos) {
					if (l > w_size - copy_pos)
						l = w_size - copy_pos;
				} else {
					if (l > w_size - w_pos)
						l = w_size - w_pos;
				}
				if ((copy_pos + l < w_pos)
				    || (w_pos + l < copy_pos)) {
					/* No overlap. */
					memcpy(w_buff + w_pos,
					    w_buff + copy_pos, l);
				} else {
					const unsigned char *s;
					unsigned char *d;
					int li;

					d = w_buff + w_pos;
					s = w_buff + copy_pos;
					for (li = 0; li < l-1;) {
						d[li] = s[li];li++;
						d[li] = s[li];li++;
					}
					if (li < l)
						d[li] = s[li];
				}
				w_pos += l;
				if (w_pos == w_size) {
					w_pos = 0;
					lzh_emit_window(strm, w_size);
					if (copy_len <= l)
						state = ST_GET_LITERAL;
					else {
						state = ST_COPY_DATA;
						ds->copy_len = copy_len - l;
						ds->copy_pos =
						    (copy_pos + l) & w_mask;
					}
					goto next_data;
				}
				if (copy_len <= l)
					/* A copy of current pattern ended. */
					break;
				copy_len -= l;
				copy_pos = (copy_pos + l) & w_mask;
			}
			state = ST_GET_LITERAL;
			break;
		}
	}
failed:
	return (ds->error = ARCHIVE_FAILED);
next_data:
	ds->br = bre;
	ds->blocks_avail = blocks_avail;
	ds->state = state;
	ds->w_pos = w_pos;
	return (ARCHIVE_OK);
}